

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capnpc-capnp.c++
# Opt level: O0

bool __thiscall
capnp::anon_unknown_1::CapnpcCapnpMain::isEmptyValue(CapnpcCapnpMain *this,Reader value)

{
  int8_t iVar1;
  uint8_t uVar2;
  bool bVar3;
  Which WVar4;
  int16_t iVar5;
  uint16_t uVar6;
  int32_t iVar7;
  uint32_t uVar8;
  int64_t iVar9;
  uint64_t uVar10;
  float fVar11;
  double dVar12;
  CapnpcCapnpMain *this_local;
  
  WVar4 = capnp::schema::Value::Reader::which(&value);
  switch(WVar4) {
  case VOID:
    this_local._7_1_ = true;
    break;
  case BOOL:
    bVar3 = capnp::schema::Value::Reader::getBool(&value);
    this_local._7_1_ = !bVar3;
    break;
  case INT8:
    iVar1 = capnp::schema::Value::Reader::getInt8(&value);
    this_local._7_1_ = iVar1 == '\0';
    break;
  case INT16:
    iVar5 = capnp::schema::Value::Reader::getInt16(&value);
    this_local._7_1_ = iVar5 == 0;
    break;
  case INT32:
    iVar7 = capnp::schema::Value::Reader::getInt32(&value);
    this_local._7_1_ = iVar7 == 0;
    break;
  case INT64:
    iVar9 = capnp::schema::Value::Reader::getInt64(&value);
    this_local._7_1_ = iVar9 == 0;
    break;
  case UINT8:
    uVar2 = capnp::schema::Value::Reader::getUint8(&value);
    this_local._7_1_ = uVar2 == '\0';
    break;
  case UINT16:
    uVar6 = capnp::schema::Value::Reader::getUint16(&value);
    this_local._7_1_ = uVar6 == 0;
    break;
  case UINT32:
    uVar8 = capnp::schema::Value::Reader::getUint32(&value);
    this_local._7_1_ = uVar8 == 0;
    break;
  case UINT64:
    uVar10 = capnp::schema::Value::Reader::getUint64(&value);
    this_local._7_1_ = uVar10 == 0;
    break;
  case FLOAT32:
    fVar11 = capnp::schema::Value::Reader::getFloat32(&value);
    this_local._7_1_ = fVar11 == 0.0;
    break;
  case FLOAT64:
    dVar12 = capnp::schema::Value::Reader::getFloat64(&value);
    this_local._7_1_ = dVar12 == 0.0;
    break;
  case TEXT:
    bVar3 = capnp::schema::Value::Reader::hasText(&value);
    this_local._7_1_ = (bool)((bVar3 ^ 0xffU) & 1);
    break;
  case DATA:
    bVar3 = capnp::schema::Value::Reader::hasData(&value);
    this_local._7_1_ = (bool)((bVar3 ^ 0xffU) & 1);
    break;
  case LIST:
    bVar3 = capnp::schema::Value::Reader::hasList(&value);
    this_local._7_1_ = (bool)((bVar3 ^ 0xffU) & 1);
    break;
  case ENUM:
    uVar6 = capnp::schema::Value::Reader::getEnum(&value);
    this_local._7_1_ = uVar6 == 0;
    break;
  case STRUCT:
    bVar3 = capnp::schema::Value::Reader::hasStruct(&value);
    this_local._7_1_ = (bool)((bVar3 ^ 0xffU) & 1);
    break;
  case INTERFACE:
    this_local._7_1_ = true;
    break;
  case ANY_POINTER:
    this_local._7_1_ = true;
    break;
  default:
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool isEmptyValue(schema::Value::Reader value) {
    switch (value.which()) {
      case schema::Value::VOID: return true;
      case schema::Value::BOOL: return value.getBool() == false;
      case schema::Value::INT8: return value.getInt8() == 0;
      case schema::Value::INT16: return value.getInt16() == 0;
      case schema::Value::INT32: return value.getInt32() == 0;
      case schema::Value::INT64: return value.getInt64() == 0;
      case schema::Value::UINT8: return value.getUint8() == 0;
      case schema::Value::UINT16: return value.getUint16() == 0;
      case schema::Value::UINT32: return value.getUint32() == 0;
      case schema::Value::UINT64: return value.getUint64() == 0;
      case schema::Value::FLOAT32: return value.getFloat32() == 0;
      case schema::Value::FLOAT64: return value.getFloat64() == 0;
      case schema::Value::TEXT: return !value.hasText();
      case schema::Value::DATA: return !value.hasData();
      case schema::Value::LIST: return !value.hasList();
      case schema::Value::ENUM: return value.getEnum() == 0;
      case schema::Value::STRUCT: return !value.hasStruct();
      case schema::Value::INTERFACE: return true;
      case schema::Value::ANY_POINTER: return true;
    }
    return true;
  }